

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

ElabSystemTaskSymbol *
slang::ast::ElabSystemTaskSymbol::fromSyntax(Compilation *compilation,ElabSystemTaskSyntax *syntax)

{
  ElabSystemTaskSymbol *pEVar1;
  ElabSystemTaskKind taskKind;
  undefined1 in_stack_00000088 [16];
  ElabSystemTaskKind local_2c;
  SourceLocation local_28;
  
  local_2c = SemanticFacts::getElabSystemTaskKind((Token)in_stack_00000088);
  local_28 = parsing::Token::location(&syntax->name);
  pEVar1 = BumpAllocator::
           emplace<slang::ast::ElabSystemTaskSymbol,slang::ast::ElabSystemTaskKind&,slang::SourceLocation>
                     (&compilation->super_BumpAllocator,&local_2c,&local_28);
  (pEVar1->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  return pEVar1;
}

Assistant:

ElabSystemTaskSymbol& ElabSystemTaskSymbol::fromSyntax(Compilation& compilation,
                                                       const ElabSystemTaskSyntax& syntax) {
    // Just create the symbol now. The diagnostic will be issued later
    // when someone visits the symbol and asks for it.
    auto taskKind = SemanticFacts::getElabSystemTaskKind(syntax.name);
    auto result = compilation.emplace<ElabSystemTaskSymbol>(taskKind, syntax.name.location());
    result->setSyntax(syntax);
    return *result;
}